

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

LogicalNotLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_logicalnot(NeuralNetworkLayer *this)

{
  LogicalNotLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x352) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x352;
    this_00 = (LogicalNotLayerParams *)operator_new(0x18);
    LogicalNotLayerParams::LogicalNotLayerParams(this_00);
    (this->layer_).logicalnot_ = this_00;
  }
  return (LogicalNotLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalNotLayerParams* NeuralNetworkLayer::mutable_logicalnot() {
  if (!has_logicalnot()) {
    clear_layer();
    set_has_logicalnot();
    layer_.logicalnot_ = new ::CoreML::Specification::LogicalNotLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.logicalNot)
  return layer_.logicalnot_;
}